

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

size_t phosg::skip_whitespace(string *s,size_t offset)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = s->_M_string_length;
  sVar2 = offset;
  if (offset < uVar1) {
    do {
      uVar3 = (ulong)(byte)(s->_M_dataplus)._M_p[offset];
      if (0x20 < uVar3) {
        return offset;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        return offset;
      }
      offset = offset + 1;
      sVar2 = uVar1;
    } while (uVar1 != offset);
  }
  return sVar2;
}

Assistant:

size_t skip_whitespace(const string& s, size_t offset) {
  while (offset < s.length() &&
      (s[offset] == ' ' || s[offset] == '\t' || s[offset] == '\r' || s[offset] == '\n')) {
    offset++;
  }
  return offset;
}